

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginDocked(ImGuiWindow *window,bool *p_open)

{
  byte bVar1;
  ImGuiTabBar *tab_bar;
  ImGuiContext *ctx;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID IVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ImGuiContext *g;
  ImGuiDockNode *pIVar8;
  ImGuiTabItem *it;
  char cVar9;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 uVar10;
  undefined1 extraout_DL_03;
  short sVar11;
  ImGuiDockNode *node;
  
  ctx = GImGui;
  bVar3 = GetWindowAlwaysWantOwnTabBar(window);
  uVar10 = extraout_DL;
  if (bVar3) {
    if (window->DockId == 0) {
      if (window->DockNode != (ImGuiDockNode *)0x0) {
        __assert_fail("window->DockNode == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x3a2b,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
      }
      IVar4 = DockContextGenNodeID(ctx);
      window->DockId = IVar4;
      uVar10 = extraout_DL_00;
    }
  }
  else {
    cVar9 = '\0';
    if ((((ctx->NextWindowData).Flags & 1) != 0) &&
       (uVar7 = (ctx->NextWindowData).PosCond, uVar10 = (undefined1)uVar7,
       (window->SetWindowPosAllowFlags & uVar7) != 0)) {
      cVar9 = (ctx->NextWindowData).PosUndock;
    }
    if (cVar9 != '\0' || ((uint)window->Flags >> 0x15 & 1) != 0) goto LAB_0012b6ee;
  }
  pIVar8 = window->DockNode;
  IVar4 = window->DockId;
  if (pIVar8 == (ImGuiDockNode *)0x0) {
    if (IVar4 == 0) {
      pIVar8 = (ImGuiDockNode *)0x0;
    }
    else {
      pIVar8 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,IVar4);
      if (pIVar8 == (ImGuiDockNode *)0x0) {
        pIVar8 = DockContextAddNode(ctx,IVar4);
        uVar7 = *(uint *)&pIVar8->field_0xb8 & 0xfffffe00 | 0x92;
        *(short *)&pIVar8->field_0xb8 = (short)uVar7;
        pIVar8->LastFrameAlive = ctx->FrameCount;
      }
      else {
        uVar10 = extraout_DL_02;
        if (pIVar8->ChildNodes[0] != (ImGuiDockNode *)0x0) goto LAB_0012b6ee;
        uVar7 = (uint)*(ushort *)&pIVar8->field_0xb8;
      }
      node = pIVar8;
      if ((uVar7 >> 9 & 1) == 0) {
        while ((uVar7 >> 9 & 1) == 0) {
          *(ushort *)&node->field_0xb8 = (ushort)uVar7 | 0x200;
          node->field_0xba = node->field_0xba | 8;
          if (node->ParentNode != (ImGuiDockNode *)0x0) {
            node = node->ParentNode;
          }
          uVar7 = (uint)*(ushort *)&node->field_0xb8;
        }
        if (((node->Size).x <= 0.0) || ((node->Size).y <= 0.0)) {
          __assert_fail("ancestor_node->Size.x > 0.0f && ancestor_node->Size.y > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x3a17,
                        "ImGuiDockNode *ImGui::DockContextBindNodeToWindow(ImGuiContext *, ImGuiWindow *)"
                       );
        }
        DockNodeTreeUpdatePosSize(node,node->Pos,node->Size,true);
      }
      DockNodeAddWindow(pIVar8,window,true);
      if (pIVar8 != window->DockNode) {
        __assert_fail("node == window->DockNode",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x3a1d,
                      "ImGuiDockNode *ImGui::DockContextBindNodeToWindow(ImGuiContext *, ImGuiWindow *)"
                     );
      }
      uVar10 = extraout_DL_03;
      if (pIVar8 == (ImGuiDockNode *)0x0) {
        return;
      }
    }
  }
  else if (IVar4 != pIVar8->ID) {
    __assert_fail("window->DockId == node->ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3a3f,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  if (pIVar8->LastFrameAlive < ctx->FrameCount) {
    pIVar8 = DockNodeGetRootNode((ImGuiDockNode *)(ulong)(uint)pIVar8->LastFrameAlive);
    uVar10 = extraout_DL_01;
    if (ctx->FrameCount <= pIVar8->LastFrameAlive) {
      window->field_0x492 = (window->field_0x492 & 0xfc) + 1;
      return;
    }
LAB_0012b6ee:
    DockContextProcessUndockWindow((ImGuiContext *)window,(ImGuiWindow *)0x1,(bool)uVar10);
    return;
  }
  if (pIVar8->HostWindow == (ImGuiWindow *)0x0) {
    window->field_0x492 =
         window->field_0x492 & 0xfc |
         pIVar8->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
    return;
  }
  if (pIVar8->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    __assert_fail("node->IsLeafNode()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3a6e,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  if (((pIVar8->Size).x < 0.0) || ((pIVar8->Size).y < 0.0)) {
    __assert_fail("node->Size.x >= 0.0f && node->Size.y >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3a6f,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  pIVar8->State = ImGuiDockNodeState_HostWindowVisible;
  pIVar2 = GImGui;
  if (window->BeginOrderWithinContext < pIVar8->HostWindow->BeginOrderWithinContext)
  goto LAB_0012b6ee;
  uVar7 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar7 | 1;
  (pIVar2->NextWindowData).PosVal = pIVar8->Pos;
  (pIVar2->NextWindowData).PosPivotVal.x = 0.0;
  (pIVar2->NextWindowData).PosPivotVal.y = 0.0;
  (pIVar2->NextWindowData).PosCond = 1;
  (pIVar2->NextWindowData).PosUndock = true;
  (pIVar2->NextWindowData).Flags = uVar7 | 3;
  (pIVar2->NextWindowData).SizeVal = pIVar8->Size;
  (pIVar2->NextWindowData).SizeCond = 1;
  (ctx->NextWindowData).PosUndock = false;
  bVar1 = window->field_0x492;
  window->field_0x492 = (bVar1 & 0xfc) + 1;
  if ((pIVar8->SharedFlags & 1) != 0) {
    return;
  }
  if (pIVar8->VisibleWindow == window) {
    window->field_0x492 = bVar1 | 3;
  }
  uVar7 = window->Flags;
  if ((uVar7 >> 0x18 & 1) != 0) {
    __assert_fail("(window->Flags & ImGuiWindowFlags_ChildWindow) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3a87,"void ImGui::BeginDocked(ImGuiWindow *, bool *)");
  }
  uVar5 = uVar7 | 0x1010003;
  if ((pIVar8->LocalFlags & 0x3000) == 0) {
    uVar5 = uVar7 & 0xfefefffc | 0x1010002;
  }
  window->Flags = uVar5;
  if ((pIVar8->TabBar != (ImGuiTabBar *)0x0) && (pIVar8->TabBar->CurrFrameVisible != -1)) {
    tab_bar = window->DockNode->TabBar;
    sVar11 = -1;
    if ((tab_bar != (ImGuiTabBar *)0x0) &&
       (it = TabBarFindTabByID(tab_bar,window->ID), it != (ImGuiTabItem *)0x0)) {
      iVar6 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,it);
      sVar11 = (short)iVar6;
    }
    window->DockOrder = sVar11;
  }
  if ((pIVar8->field_0xb9 & 0x40) == 0) {
    if ((p_open == (bool *)0x0) || (pIVar8->WantCloseTabId != window->ID)) goto LAB_0012b7fc;
  }
  else if (p_open == (bool *)0x0) goto LAB_0012b7fc;
  *p_open = false;
LAB_0012b7fc:
  IVar4 = ImGuiWindow::GetID(window->DockNode->HostWindow,window->Name,(char *)0x0);
  window->ChildId = IVar4;
  return;
}

Assistant:

void ImGui::BeginDocked(ImGuiWindow* window, bool* p_open)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    const bool auto_dock_node = GetWindowAlwaysWantOwnTabBar(window);
    if (auto_dock_node)
    {
        if (window->DockId == 0)
        {
            IM_ASSERT(window->DockNode == NULL);
            window->DockId = DockContextGenNodeID(ctx);
        }
    }
    else
    {
        // Calling SetNextWindowPos() undock windows by default (by setting PosUndock)
        bool want_undock = false;
        want_undock |= (window->Flags & ImGuiWindowFlags_NoDocking) != 0;
        want_undock |= (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) && (window->SetWindowPosAllowFlags & g.NextWindowData.PosCond) && g.NextWindowData.PosUndock;
        if (want_undock)
        {
            DockContextProcessUndockWindow(ctx, window);
            return;
        }
    }

    // Bind to our dock node
    ImGuiDockNode* node = window->DockNode;
    if (node != NULL)
        IM_ASSERT(window->DockId == node->ID);
    if (window->DockId != 0 && node == NULL)
    {
        node = DockContextBindNodeToWindow(ctx, window);
        if (node == NULL)
            return;
    }

#if 0
    // Undock if the ImGuiDockNodeFlags_NoDockingInCentralNode got set
    if (node->IsCentralNode && (node->Flags & ImGuiDockNodeFlags_NoDockingInCentralNode))
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }
#endif

    // Undock if our dockspace node disappeared
    // Note how we are testing for LastFrameAlive and NOT LastFrameActive. A DockSpace node can be maintained alive while being inactive with ImGuiDockNodeFlags_KeepAliveOnly.
    if (node->LastFrameAlive < g.FrameCount)
    {
        // If the window has been orphaned, transition the docknode to an implicit node processed in DockContextUpdateDocking()
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->LastFrameAlive < g.FrameCount)
        {
            DockContextProcessUndockWindow(ctx, window);
        }
        else
        {
            window->DockIsActive = true;
            window->DockTabIsVisible = false;
        }
        return;
    }

    // Fast path return. It is common for windows to hold on a persistent DockId but be the only visible window,
    // and never create neither a host window neither a tab bar.
    // FIXME-DOCK: replace ->HostWindow NULL compare with something more explicit (~was initially intended as a first frame test)
    if (node->HostWindow == NULL)
    {
        window->DockIsActive = (node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing);
        window->DockTabIsVisible = false;
        return;
    }

    // We can have zero-sized nodes (e.g. children of a small-size dockspace)
    IM_ASSERT(node->HostWindow);
    IM_ASSERT(node->IsLeafNode());
    IM_ASSERT(node->Size.x >= 0.0f && node->Size.y >= 0.0f);
    node->State = ImGuiDockNodeState_HostWindowVisible;

    // Undock if we are submitted earlier than the host window
    if (window->BeginOrderWithinContext < node->HostWindow->BeginOrderWithinContext)
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }

    // Position/Size window
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false; // Cancel implicit undocking of SetNextWindowPos()
    window->DockIsActive = true;
    window->DockTabIsVisible = false;
    if (node->SharedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return;

    // When the window is selected we mark it as visible.
    if (node->VisibleWindow == window)
        window->DockTabIsVisible = true;

    // Update window flag
    IM_ASSERT((window->Flags & ImGuiWindowFlags_ChildWindow) == 0);
    window->Flags |= ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysUseWindowPadding | ImGuiWindowFlags_NoResize;
    if (node->IsHiddenTabBar() || node->IsNoTabBar())
        window->Flags |= ImGuiWindowFlags_NoTitleBar;
    else
        window->Flags &= ~ImGuiWindowFlags_NoTitleBar;      // Clear the NoTitleBar flag in case the user set it: confusingly enough we need a title bar height so we are correctly offset, but it won't be displayed!

    // Save new dock order only if the tab bar has been visible once.
    // This allows multiple windows to be created in the same frame and have their respective dock orders preserved.
    if (node->TabBar && node->TabBar->CurrFrameVisible != -1)
        window->DockOrder = (short)DockNodeGetTabOrder(window);

    if ((node->WantCloseAll || node->WantCloseTabId == window->ID) && p_open != NULL)
        *p_open = false;

    // Update ChildId to allow returning from Child to Parent with Escape
    ImGuiWindow* parent_window = window->DockNode->HostWindow;
    window->ChildId = parent_window->GetID(window->Name);
}